

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packed-cache-inl.h
# Opt level: O0

bool __thiscall PackedCache<35>::TryGet(PackedCache<35> *this,K key,V *out)

{
  T TVar1;
  ulong uVar2;
  T entry;
  T expected_entry;
  T hash;
  V *out_local;
  K key_local;
  PackedCache<35> *this_local;
  
  TVar1 = Hash(key);
  uVar2 = key & 0xffffffffffff0000 ^ this->array_[TVar1];
  if (uVar2 < 0x80) {
    *out = (V)uVar2;
  }
  return uVar2 < 0x80;
}

Assistant:

bool TryGet(K key, V* out) const {
    // As with other code in this class, we touch array_ as few times
    // as we can.  Assuming entries are read atomically then certain
    // races are harmless.
    ASSERT(key == (key & kKeyMask));
    T hash = Hash(key);
    T expected_entry = key;
    expected_entry &= ~N_ONES_(T, kHashbits);
    T entry = array_[hash];
    entry ^= expected_entry;
    if (PREDICT_FALSE(entry >= (1 << kValuebits))) {
      return false;
    }
    *out = static_cast<V>(entry);
    return true;
  }